

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::randomString_abi_cxx11_(size_type length)

{
  result_type rVar1;
  long in_RSI;
  string *in_RDI;
  long *in_FS_OFFSET;
  string *randomString;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffec18;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffec20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec30;
  undefined1 *in_stack_ffffffffffffec38;
  undefined4 in_stack_ffffffffffffec40;
  result_type_conflict2 in_stack_ffffffffffffec44;
  random_device *in_stack_ffffffffffffec60;
  undefined1 local_1398 [5000];
  long local_10 [2];
  
  local_10[0] = in_RSI;
  if (*(char *)(*in_FS_OFFSET + -0x20) == '\0') {
    in_stack_ffffffffffffec38 = local_1398;
    std::random_device::random_device(in_stack_ffffffffffffec60);
    in_stack_ffffffffffffec44 = std::random_device::operator()((random_device *)0x6a54f3);
    in_stack_ffffffffffffec30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)(in_stack_ffffffffffffec44 + (int)local_10);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffec20,(result_type)in_stack_ffffffffffffec18);
    std::random_device::~random_device((random_device *)0x6a5535);
    *(undefined1 *)(*in_FS_OFFSET + -0x20) = 1;
  }
  if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)in_stack_ffffffffffffec20,
               (unsigned_long)in_stack_ffffffffffffec18,0x6a557f);
    *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
  }
  std::__cxx11::string::string(in_stack_ffffffffffffec30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffec44,in_stack_ffffffffffffec40),
             (size_type)in_stack_ffffffffffffec38);
  while (local_10[0] != 0) {
    local_10[0] = local_10[0] + -1;
    rVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)(*in_FS_OFFSET + -0x18),
                       in_stack_ffffffffffffec18);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffec30,(char)(rVar1 >> 0x38));
  }
  return in_RDI;
}

Assistant:

std::string randomString(std::string::size_type length)
{
    static constexpr auto chars =
        "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    thread_local static std::mt19937 rng{
        std::random_device{}() +
        static_cast<uint32_t>(
            reinterpret_cast<uint64_t>(&length) &  // NOLINT
            0xFFFFFFFFU)};
    thread_local static std::uniform_int_distribution<std::string::size_type>
        pick(0, 61);
    std::string randomString;

    randomString.reserve(length);

    while (length-- != 0U) {
        randomString.push_back(chars[pick(rng)]);
    }

    return randomString;
}